

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

bool ON_EvaluateNurbsBasisDerivatives(int order,double *knot,int der_count,double *N)

{
  double *pdVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double stack_buffer [80];
  double *local_300;
  double local_2b8 [81];
  
  lVar20 = (long)(((order >> 1) + 2) * order);
  uVar14 = (der_count + lVar20) * 8 + 8;
  if (uVar14 < 0x281) {
    pdVar3 = local_2b8;
    local_300 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)onmalloc(uVar14);
    local_300 = pdVar3;
  }
  uVar2 = order - 1;
  lVar4 = (long)order;
  pdVar8 = pdVar3 + lVar4;
  pdVar1 = pdVar3 + lVar20;
  pdVar5 = pdVar8 + lVar4;
  *pdVar1 = (double)pdVar5;
  if (0 < der_count) {
    lVar7 = (long)(int)uVar2;
    lVar20 = lVar7 * 8;
    uVar14 = 0;
    pdVar18 = knot;
    uVar16 = uVar2;
    do {
      if ((long)uVar14 < lVar7) {
        uVar12 = 0;
        do {
          pdVar5[uVar12] = 1.0 / (knot[lVar7 + uVar12] - pdVar18[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      pdVar18 = pdVar18 + 1;
      pdVar5 = (double *)((long)pdVar5 + lVar20);
      pdVar1[uVar14 + 1] = (double)pdVar5;
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 - 1;
      lVar20 = lVar20 + -8;
    } while (uVar14 != (uint)der_count);
  }
  pdVar5 = N + lVar4;
  if (0 < order) {
    uVar16 = 1;
    lVar7 = -8;
    lVar20 = 0;
    uVar14 = 0;
    do {
      *pdVar3 = 1.0;
      if (0 < der_count) {
        lVar15 = uVar2 - uVar14;
        lVar17 = (long)pdVar5 + lVar20;
        uVar12 = 1;
        lVar6 = lVar20;
        pdVar18 = pdVar8;
        lVar19 = lVar7;
        uVar11 = uVar16;
        do {
          pdVar8 = pdVar3;
          pdVar3 = pdVar18;
          uVar9 = 1;
          if (1 < (int)uVar11) {
            uVar9 = (ulong)uVar11;
          }
          uVar13 = uVar12 - uVar14;
          if ((long)uVar13 < 1) {
            dVar22 = *pdVar8 * *(double *)((long)pdVar1[uVar12 - 1] + (uVar14 - uVar12) * 8);
            *pdVar3 = dVar22;
            dVar22 = dVar22 * pdVar5[uVar14];
            uVar13 = 1;
          }
          else {
            dVar22 = 0.0;
          }
          if (lVar15 < (long)uVar12) {
            if ((int)uVar13 <= lVar15) {
              lVar10 = uVar9 - 1;
              dVar21 = pdVar1[uVar12 - 1];
              do {
                dVar23 = (pdVar8[lVar10 + 1] - pdVar8[lVar10]) *
                         *(double *)((long)dVar21 + lVar6 + lVar10 * 8);
                pdVar3[lVar10 + 1] = dVar23;
                dVar22 = dVar22 + dVar23 * *(double *)(lVar17 + 8 + lVar10 * 8);
                lVar10 = lVar10 + 1;
              } while (lVar10 < lVar15);
            }
          }
          else {
            dVar21 = pdVar1[uVar12 - 1];
            if ((uVar13 & 0xffffffff) < uVar12) {
              do {
                dVar23 = (pdVar8[uVar9] - pdVar8[uVar9 - 1]) *
                         *(double *)((long)dVar21 + lVar19 + uVar9 * 8);
                pdVar3[uVar9] = dVar23;
                dVar22 = dVar22 + dVar23 * *(double *)(lVar17 + uVar9 * 8);
                uVar9 = uVar9 + 1;
              } while (uVar9 < uVar12);
            }
            dVar21 = -pdVar8[uVar12 - 1] * *(double *)((long)dVar21 + uVar14 * 8);
            pdVar3[uVar12] = dVar21;
            dVar22 = dVar22 + dVar21 * pdVar5[uVar12 + uVar14];
          }
          pdVar5[uVar14] = dVar22;
          pdVar5 = pdVar5 + lVar4;
          uVar12 = uVar12 + 1;
          uVar11 = uVar11 + 1;
          lVar17 = lVar17 + lVar4 * 8;
          lVar19 = lVar19 + -8;
          lVar6 = lVar6 + -8;
          pdVar18 = pdVar8;
        } while (uVar12 != der_count + 1);
      }
      pdVar5 = pdVar5 + -(order * der_count);
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 - 1;
      lVar20 = lVar20 + 8;
      lVar7 = lVar7 + 8;
    } while (uVar14 != (uint)order);
  }
  if (der_count != 0) {
    dVar21 = (double)(int)uVar2;
    dVar22 = dVar21;
    do {
      uVar14 = (ulong)(uint)order;
      pdVar3 = pdVar5;
      if (order != 0) {
        do {
          pdVar5 = pdVar3 + 1;
          *pdVar3 = *pdVar3 * dVar22;
          uVar2 = (int)uVar14 - 1;
          uVar14 = (ulong)uVar2;
          pdVar3 = pdVar5;
        } while (uVar2 != 0);
      }
      dVar21 = dVar21 + -1.0;
      dVar22 = dVar22 * dVar21;
      der_count = der_count + -1;
    } while (der_count != 0);
  }
  if (local_300 != (double *)0x0) {
    onfree(local_300);
  }
  return true;
}

Assistant:

bool ON_EvaluateNurbsBasisDerivatives(
  int order,
  const double* knot, 
  int der_count,
  double* N 
)
{
	double dN, c;
	const double *k0, *k1;
	double *a0, *a1, *ptr, **dk;
	int i, j, k, jmax;

	const int d = order-1;
	const int Nstride = -der_count*order;

	/* workspaces for knot differences and coefficients 
	 *
	 * a0[] and a1[] have order doubles
	 *
	 * dk[0] = array of d knot differences
	 * dk[1] = array of (d-1) knot differences
	 *
	 * dk[der_count-1] = 1.0/(knot[d] - knot[d-1])
	 * dk[der_count] = dummy pointer to make loop efficient
	 */

	//dk = (double**)alloca( (der_count+1) << 3 ); /* << 3 in case pointers are 8 bytes long */
	//a0 = (double*)alloca( (order*(2 + ((d+1)>>1))) << 3 ); /* d for a0, d for a1, d*order/2 for dk[]'s and slop to avoid /2 */
	//a1 = a0 + order;

  double stack_buffer[80];
  void* heap_buffer = 0;
  const size_t dbl_count = (order*(2 + ((d+1)>>1)));
  const size_t sz = ( dbl_count*sizeof(*a0) + (der_count+1)*sizeof(*dk) );

  a0 = (sz <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer = onmalloc(sz));
	a1 = a0 + order;
  dk = (double**)(a0 + dbl_count);

	/* initialize reciprocal of knot differences */
	dk[0] = a1 + order;
	for (k = 0; k < der_count; k++) {
		j = d-k;
		k0 = knot++;
		k1 = k0 + j;
		for (i = 0; i < j; i++) 
			dk[k][i] = 1.0/(*k1++ - *k0++);
		dk[k+1] = dk[k] + j;
	}
	dk--;
	/* dk[1] = 1/{t[d]-t[0], t[d+1]-t[1], ..., t[2d-2] - t[d-2], t[2d-1] - t[d-1]}
	 *       = diffs needed for 1rst derivative
	 * dk[2] = 1/{t[d]-t[1], t[d+1]-t[2], ..., t[2d-2] - t[d-1]}
	 *       = diffs needed for 2nd derivative
	 * ...
	 * dk[d] = 1/{t[d] - t[d-1]}
	 *       = diff needed for d-th derivative
	 *
	 * d[k][n] = 1.0/( t[d+n] - t[k-1+n] )
	 */
	
	N += order;
	/* set N[0] ,..., N[d] = 1rst derivatives, 
	 * N[order], ..., N[order+d] = 2nd, etc.
	 */
	for ( i=0; i<order; i++) {
		a0[0] = 1.0;
		for (k = 1; k <= der_count; k++) {
			/* compute k-th derivative of N_i^d up to d!/(d-k)! scaling factor */
			dN = 0.0;
			j = k-i; 
			if (j <= 0) {
				dN = (a1[0] = a0[0]*dk[k][i-k])*N[i];
				j = 1;
			}
			jmax = d-i; 
			if (jmax < k) {
				while (j <= jmax) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
			}
			else {
				/* sum j all the way to j = k */
				while (j < k) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
				dN += (a1[k] = -a0[k-1]*dk[k][i])*N[i+k];
			}

			/* d!/(d-k)!*dN = value of k-th derivative */
			N[i] = dN;
			N += order;
			/* a1[] s for next derivative = linear combination
			 * of a[]s used to compute this derivative.
			 */
			ptr = a0; a0 = a1; a1 = ptr;
		}
		N += Nstride;
	}

	/* apply d!/(d-k)! scaling factor */
	dN = c = (double)d;
	k = der_count;
	while (k--) {
		i = order;
		while (i--)
			*N++ *= c;
		dN -= 1.0;
		c *= dN;
	}

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return true;
}